

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::Base64Handler::encode
          (Base64Handler *this,JsonCodec *codec,Reader input,Builder output)

{
  bool in_R8B;
  ArrayPtr<const_unsigned_char> input_00;
  String local_50;
  ArrayPtr<const_char> local_38;
  JsonCodec *local_28;
  JsonCodec *codec_local;
  Base64Handler *this_local;
  Reader input_local;
  
  input_local.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)input.super_ArrayPtr<const_unsigned_char>.size_;
  this_local = (Base64Handler *)input.super_ArrayPtr<const_unsigned_char>.ptr;
  input_00.size_ = 0;
  input_00.ptr = input_local.super_ArrayPtr<const_unsigned_char>.ptr;
  local_28 = codec;
  codec_local = (JsonCodec *)this;
  kj::encodeBase64(&local_50,(kj *)this_local,input_00,in_R8B);
  Text::Reader::Reader((Reader *)&local_38,&local_50);
  json::Value::Builder::setString(&output,(Reader)local_38);
  kj::String::~String(&local_50);
  return;
}

Assistant:

void encode(const JsonCodec& codec, capnp::Data::Reader input, JsonValue::Builder output) const {
    output.setString(kj::encodeBase64(input));
  }